

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O0

void __thiscall Matrix3f::transpose(Matrix3f *this)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  Matrix3f *in_RDI;
  int j;
  int i;
  float temp;
  undefined4 local_14;
  undefined4 local_10;
  
  for (local_10 = 0; local_14 = local_10, local_10 < 2; local_10 = local_10 + 1) {
    while (local_14 = local_14 + 1, local_14 < 3) {
      pfVar3 = operator()(in_RDI,local_10,local_14);
      fVar1 = *pfVar3;
      pfVar3 = operator()(in_RDI,local_14,local_10);
      fVar2 = *pfVar3;
      pfVar3 = operator()(in_RDI,local_10,local_14);
      *pfVar3 = fVar2;
      pfVar3 = operator()(in_RDI,local_14,local_10);
      *pfVar3 = fVar1;
    }
  }
  return;
}

Assistant:

void Matrix3f::transpose()
{
	float temp;

	for( int i = 0; i < 2; ++i )
	{
		for( int j = i + 1; j < 3; ++j )
		{
			temp = ( *this )( i, j );
			( *this )( i, j ) = ( *this )( j, i );
			( *this )( j, i ) = temp;
		}
	}
}